

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  time_t tVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  string tempDir;
  Rand48 rand48;
  
  tVar1 = time((time_t *)0x0);
  uVar5 = tVar1 * 0xa5a573a5 ^ 0x5a5a5a5a;
  rand48._state[0] = (unsigned_short)uVar5;
  rand48._state[1] = (unsigned_short)(uVar5 >> 0x10);
  tempDir._M_dataplus._M_p = (pointer)&tempDir.field_2;
  tempDir._M_string_length = 0;
  tempDir.field_2._M_local_buf[0] = '\0';
  rand48._state[2] = rand48._state[0];
  while( true ) {
    std::__cxx11::string::assign((char *)&tempDir);
    iVar6 = 8;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      Imath_3_2::nrand48(rand48._state);
      std::__cxx11::string::push_back((char)&tempDir);
    }
    iVar6 = mkdir(tempDir._M_dataplus._M_p,0x1ff);
    if (iVar6 == 0) break;
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot create directory ");
      poVar3 = std::operator<<(poVar3,(string *)&tempDir);
      poVar3 = std::operator<<(poVar3,". ");
      pcVar4 = strerror(*piVar2);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar6 = 1;
LAB_00105b64:
      std::__cxx11::string::~string((string *)&tempDir);
      return iVar6;
    }
  }
  std::__cxx11::string::append((char *)&tempDir);
  poVar3 = std::operator<<((ostream *)&std::cout,"using temporary directory ");
  poVar3 = std::operator<<(poVar3,(string *)&tempDir);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (argc < 2) {
LAB_00105ada:
    testFlatImage(&tempDir);
    if (1 < argc) {
      pcVar4 = argv[1];
      goto LAB_00105aed;
    }
LAB_00105b00:
    testDeepImage(&tempDir);
    if (1 < argc) {
      pcVar4 = argv[1];
      goto LAB_00105b13;
    }
LAB_00105b26:
    testIO(&tempDir);
  }
  else {
    pcVar4 = argv[1];
    iVar6 = strcmp(pcVar4,"testFlatImage");
    if (iVar6 == 0) goto LAB_00105ada;
LAB_00105aed:
    iVar6 = strcmp(pcVar4,"testDeepImage");
    if (iVar6 == 0) goto LAB_00105b00;
LAB_00105b13:
    iVar6 = strcmp(pcVar4,"testIO");
    if (iVar6 == 0) goto LAB_00105b26;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"removing temporary directory ");
  poVar3 = std::operator<<(poVar3,(string *)&tempDir);
  std::endl<char,std::char_traits<char>>(poVar3);
  rmdir(tempDir._M_dataplus._M_p);
  iVar6 = 0;
  goto LAB_00105b64;
}

Assistant:

int
main (int argc, char* argv[])
{
    //
    // Create temporary files in a uniquely named private temporary
    // subdirectory of IMF_TMP_DIR to avoid colliding with other running
    // instances of this program.
    //

    IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
    std::string             tempDir;

    while (true)
    {
#ifdef _WIN32
        char  tmpbuf[4096];
        DWORD len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            cerr << "Cannot retrieve temporary directory" << endl;
            return 1;
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";
#else
        tempDir = IMF_TMP_DIR "OpenEXRTest_";
#endif
        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        if (mkdir (tempDir.c_str (), 0777) == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;
            break; // success
        }

        if (errno != EEXIST)
        {
            cerr << "Cannot create directory " << tempDir << ". "
                 << strerror (errno) << endl;

            return 1;
        }
    }

    cout << "using temporary directory " << tempDir << endl;

    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite
    TEST (testFlatImage);
    TEST (testDeepImage);
    TEST (testIO);
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite

    cout << "removing temporary directory " << tempDir << endl;
    rmdir (tempDir.c_str ());

    return 0;
}